

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerMessageDeflate.h
# Opt level: O0

pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool> * __thiscall
uWS::InflationStream::inflate
          (InflationStream *this,ZlibContext *zlibContext,string_view compressed,
          size_t maxPayloadLength)

{
  const_pointer pvVar1;
  size_type sVar2;
  ulong uVar3;
  long lVar4;
  long in_RDX;
  undefined8 *in_RSI;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool> *in_RDI;
  ulong in_R9;
  int err;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool> *this_00;
  bool local_99;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  bool local_81;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  undefined8 local_70;
  undefined8 local_68;
  bool local_59;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  bool local_41;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  int local_2c;
  ulong local_28;
  long local_20;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  this_00 = in_RDI;
  local_28 = in_R9;
  local_20 = in_RDX;
  std::__cxx11::string::clear();
  pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_10);
  *in_RSI = pvVar1;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length(&local_10);
  *(int *)(in_RSI + 1) = (int)sVar2;
  do {
    in_RSI[3] = *(undefined8 *)(local_20 + 0x48);
    *(undefined4 *)(in_RSI + 4) = 0x4000;
    local_2c = ::inflate(in_RSI,2);
    if ((local_2c == 0) && (*(int *)(in_RSI + 4) != 0)) break;
    std::__cxx11::string::append((char *)(local_20 + 0x20),*(ulong *)(local_20 + 0x48));
    in_stack_ffffffffffffff47 = false;
    if (*(int *)(in_RSI + 4) == 0) {
      uVar3 = std::__cxx11::string::length();
      in_stack_ffffffffffffff47 = uVar3 <= local_28;
    }
  } while ((bool)in_stack_ffffffffffffff47 != false);
  inflateReset(in_RSI);
  if (((local_2c == -5) || (local_2c == 0)) &&
     (uVar3 = std::__cxx11::string::length(), uVar3 <= local_28)) {
    lVar4 = std::__cxx11::string::length();
    if (lVar4 == 0) {
      if (local_28 < 0x4000 - *(int *)(in_RSI + 4)) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_80,(char *)0x0,0);
        local_81 = false;
        std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool>::pair<bool,_true>
                  (in_RDI,&local_80,&local_81);
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_98,*(char **)(local_20 + 0x48),(ulong)(0x4000 - *(int *)(in_RSI + 4)));
        local_99 = true;
        std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool>::pair<bool,_true>
                  (in_RDI,&local_98,&local_99);
      }
    }
    else {
      std::__cxx11::string::append((char *)(local_20 + 0x20),*(ulong *)(local_20 + 0x48));
      uVar3 = std::__cxx11::string::length();
      if (local_28 < uVar3) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_58,(char *)0x0,0);
        local_59 = false;
        std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool>::pair<bool,_true>
                  (in_RDI,&local_58,&local_59);
      }
      else {
        local_68 = std::__cxx11::string::data();
        local_70 = std::__cxx11::string::length();
        std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool>::
        pair<char_*,_unsigned_long,_true>
                  (this_00,(char **)in_RDI,
                   (unsigned_long *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
      }
    }
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_40,(char *)0x0,0);
    local_41 = false;
    std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool>::pair<bool,_true>
              (in_RDI,&local_40,&local_41);
  }
  return this_00;
}

Assistant:

std::pair<std::string_view, bool> inflate(ZlibContext *zlibContext, std::string_view compressed, size_t maxPayloadLength) {

        /* We clear this one here, could be done better */
        zlibContext->dynamicInflationBuffer.clear();

        inflationStream.next_in = (Bytef *) compressed.data();
        inflationStream.avail_in = (unsigned int) compressed.length();

        int err;
        do {
            inflationStream.next_out = (Bytef *) zlibContext->inflationBuffer;
            inflationStream.avail_out = LARGE_BUFFER_SIZE;

            err = ::inflate(&inflationStream, Z_SYNC_FLUSH);
            if (err == Z_OK && inflationStream.avail_out) {
                break;
            }

            zlibContext->dynamicInflationBuffer.append(zlibContext->inflationBuffer, LARGE_BUFFER_SIZE - inflationStream.avail_out);


        } while (inflationStream.avail_out == 0 && zlibContext->dynamicInflationBuffer.length() <= maxPayloadLength);

        inflateReset(&inflationStream);

        if ((err != Z_BUF_ERROR && err != Z_OK) || zlibContext->dynamicInflationBuffer.length() > maxPayloadLength) {
            return {{nullptr, 0}, false};
        }

        if (zlibContext->dynamicInflationBuffer.length()) {
            zlibContext->dynamicInflationBuffer.append(zlibContext->inflationBuffer, LARGE_BUFFER_SIZE - inflationStream.avail_out);

            /* Let's be strict about the max size */
            if (zlibContext->dynamicInflationBuffer.length() > maxPayloadLength) {
                return {{nullptr, 0}, false};
            }

            return {zlibContext->dynamicInflationBuffer.data(), zlibContext->dynamicInflationBuffer.length()};
        }

        /* Let's be strict about the max size */
        if ((LARGE_BUFFER_SIZE - inflationStream.avail_out) > maxPayloadLength) {
            return {{nullptr, 0}, false};
        }

        return {{zlibContext->inflationBuffer, LARGE_BUFFER_SIZE - inflationStream.avail_out}, true};
    }